

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1)

{
  bool bVar1;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  ByteCodeLabel BStack_20;
  OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  RegSlot R1_local;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  offsetOfRelativeJumpOffsetFromEnd._4_4_ = R1;
  BStack_20 = labelID;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                    ((uchar *)((long)&offsetOfRelativeJumpOffsetFromEnd + 3),R1);
  if (bVar1) {
    offsetOfRelativeJumpOffsetFromEnd._1_2_ = 3;
    Data::EncodeT<(Js::LayoutSize)0>
              (&this->m_byteCodeData,op,(void *)((long)&offsetOfRelativeJumpOffsetFromEnd + 1),3,
               this);
    AddJumpOffset(this,op,BStack_20,3);
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteBrReg1(OpCode op, ByteCodeLabel labelID, RegSlot R1)
    {
        OpLayoutT_BrReg1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R1, R1))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrReg1<SizePolicy>) - offsetof(OpLayoutT_BrReg1<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }